

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O1

void av1_ml_prune_4_partition
               (AV1_COMP *cpi,MACROBLOCK *x,int part_ctx,int64_t best_rd,
               PartitionSearchState *part_state,int *part4_allowed,uint pb_source_variance)

{
  BLOCK_SIZE bsize;
  byte bVar1;
  long lVar2;
  uint8_t *puVar3;
  bool bVar4;
  ExtPartController *ext_part_controller;
  _Bool _Var5;
  int i;
  int iVar6;
  uint uVar7;
  long lVar8;
  int64_t iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  BLOCK_SIZE BVar13;
  NN_CONFIG *pNVar14;
  uint8_t *puVar15;
  int iVar16;
  int iVar17;
  BLOCK_SIZE BVar18;
  uint uVar22;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  uint uVar34;
  uint uVar35;
  uint vert_4_source_var [4];
  uint horz_4_source_var [4];
  int int_score [4];
  float score [4];
  int sub_block_rdcost [8];
  float features [18];
  int in_stack_ffffffffffffd3b8;
  int in_stack_ffffffffffffd3c0;
  uint local_2bf8 [8];
  buf_2d local_2bd8;
  ExtPartController *local_2bb0;
  PartitionSearchState *local_2ba8;
  int64_t local_2ba0;
  undefined1 local_2b98 [8];
  undefined8 uStack_2b90;
  int local_2b80;
  undefined1 local_2b78 [556];
  undefined1 local_294c [16];
  undefined1 local_2078 [56];
  undefined1 local_2040 [16];
  int local_3c;
  int iStack_38;
  
  iVar10 = (part_state->part_blk_params).mi_row;
  iVar17 = (part_state->part_blk_params).mi_col;
  bsize = (part_state->part_blk_params).bsize;
  uVar12 = (ulong)bsize;
  if ((((cpi->common).current_frame.frame_type & 0xfd) == 0) ||
     ((cpi->ext_part_controller).ready == 0)) {
    _Var5 = false;
    goto LAB_001f41b2;
  }
  local_2b78._500_4_ = (undefined4)part_ctx;
  local_2b78._0_4_ = AOM_EXT_PART_FEATURE_AFTER_AB;
  uVar7 = 0x1f;
  if (pb_source_variance != 0) {
    for (; pb_source_variance >> uVar7 == 0; uVar7 = uVar7 - 1) {
    }
  }
  iVar6 = (uVar7 ^ 0xffffffe0) + 0x21;
  if (pb_source_variance == 0) {
    iVar6 = 0;
  }
  local_2b78._504_4_ = (undefined4)iVar6;
  local_2078._16_4_ = 0;
  local_2078._20_4_ = 0;
  local_2078._24_4_ = 0;
  local_2078._28_4_ = 0;
  local_2078._0_4_ = 0;
  local_2078._4_4_ = 0;
  local_2078._8_4_ = 0;
  local_2078._12_4_ = 0;
  lVar8 = 0;
  do {
    lVar2 = part_state->rect_part_rd[0][lVar8];
    if (lVar2 - 1U < 999999999) {
      *(int *)(local_2078 + lVar8 * 4) = (int)lVar2;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 == 1);
  lVar8 = 0;
  do {
    lVar2 = part_state->rect_part_rd[1][lVar8];
    if (lVar2 - 1U < 999999999) {
      *(int *)(local_2078 + lVar8 * 4 + 8) = (int)lVar2;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 == 1);
  lVar8 = 0;
  do {
    if (part_state->split_rd[lVar8] - 1U < 999999999) {
      *(int *)(local_2078 + lVar8 * 4 + 0x10) = (int)part_state->split_rd[lVar8];
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  iVar9 = 0x7fffffff;
  if (best_rd < 0x7fffffff) {
    iVar9 = best_rd;
  }
  iVar6 = (int)iVar9;
  auVar24._0_4_ = (float)iVar6;
  auVar24._4_4_ = auVar24._0_4_;
  auVar24._8_4_ = auVar24._0_4_;
  auVar24._12_4_ = auVar24._0_4_;
  lVar8 = 0;
  do {
    lVar2 = lVar8 * 4;
    uVar7 = *(uint *)(local_2078 + lVar2);
    uVar22 = *(uint *)(local_2078 + lVar2 + 4);
    uVar26 = *(uint *)(local_2078 + lVar2 + 8);
    uVar27 = *(uint *)(local_2078 + lVar2 + 0xc);
    uVar28 = -(uint)((int)uVar7 < iVar6 && 0 < (int)uVar7);
    uVar29 = -(uint)((int)uVar22 < iVar6 && 0 < (int)uVar22);
    uVar34 = -(uint)((int)uVar26 < iVar6 && 0 < (int)uVar26);
    uVar35 = -(uint)((int)uVar27 < iVar6 && 0 < (int)uVar27);
    auVar30._0_4_ =
         ((float)(uVar7 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar7 & 0xffff | 0x4b000000)
    ;
    auVar30._4_4_ =
         ((float)(uVar22 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar22 & 0xffff | 0x4b000000);
    auVar30._8_4_ =
         ((float)(uVar26 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar26 & 0xffff | 0x4b000000);
    auVar30._12_4_ =
         ((float)(uVar27 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar27 & 0xffff | 0x4b000000);
    auVar30 = divps(auVar30,auVar24);
    lVar2 = lVar8 * 4;
    *(uint *)(local_294c + lVar2 + -0x30) = ~uVar28 & 0x3f800000 | auVar30._0_4_ & uVar28;
    *(uint *)(local_294c + lVar2 + -0x2c) = ~uVar29 & 0x3f800000 | auVar30._4_4_ & uVar29;
    *(uint *)(local_294c + lVar2 + -0x28) = ~uVar34 & 0x3f800000 | auVar30._8_4_ & uVar34;
    *(uint *)(local_294c + lVar2 + -0x24) = ~uVar35 & 0x3f800000 | auVar30._12_4_ & uVar35;
    lVar8 = lVar8 + 4;
  } while (lVar8 != 8);
  local_2bf8[4] = 0;
  local_2bf8[5] = 0;
  local_2bf8[6] = 0;
  local_2bf8[7] = 0;
  local_2bf8[0] = 0;
  local_2bf8[1] = 0;
  local_2bf8[2] = 0;
  local_2bf8[3] = 0;
  switch(uVar12) {
  case 0:
    bVar4 = false;
    uVar11 = uVar12;
    goto LAB_001f3efe;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
switchD_001f3eb5_caseD_1:
    bVar4 = true;
    uVar11 = 6;
    goto LAB_001f3efe;
  case 3:
    uVar11 = 1;
    break;
  case 6:
    uVar11 = 2;
    break;
  case 9:
    uVar11 = 3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      uVar11 = 4;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_001f3eb5_caseD_1;
      uVar11 = 5;
    }
  }
  bVar4 = false;
LAB_001f3efe:
  BVar18 = BLOCK_INVALID;
  if (!bVar4) {
    BVar18 = subsize_lookup[8][uVar11];
  }
  switch(uVar12) {
  case 0:
    bVar4 = false;
    uVar11 = uVar12;
    goto LAB_001f3f70;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
switchD_001f3f2f_caseD_1:
    bVar4 = true;
    uVar11 = 6;
    goto LAB_001f3f70;
  case 3:
    uVar11 = 1;
    break;
  case 6:
    uVar11 = 2;
    break;
  case 9:
    uVar11 = 3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      uVar11 = 4;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_001f3f2f_caseD_1;
      uVar11 = 5;
    }
  }
  bVar4 = false;
LAB_001f3f70:
  BVar13 = BLOCK_INVALID;
  if (!bVar4) {
    BVar13 = subsize_lookup[9][uVar11];
  }
  local_2bb0 = &cpi->ext_part_controller;
  local_2ba8 = part_state;
  local_2ba0 = best_rd;
  av1_setup_src_planes
            (x,cpi->source,iVar10,iVar17,
             (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1,bsize);
  local_2bd8.stride = x->plane[0].src.stride;
  puVar3 = x->plane[0].src.buf;
  iVar6 = (uint)block_size_high[BVar18] * local_2bd8.stride;
  bVar1 = block_size_wide[BVar13];
  iVar16 = 0;
  lVar8 = 0;
  puVar15 = puVar3;
  local_2b80 = local_2bd8.stride;
  do {
    local_2b98 = (undefined1  [8])(puVar3 + iVar16);
    local_2bd8.buf = puVar15;
    uVar7 = av1_get_perpixel_variance_facade(cpi,&x->e_mbd,(buf_2d *)local_2b98,BVar18,0);
    local_2bf8[lVar8 + 4] = uVar7;
    uVar7 = av1_get_perpixel_variance_facade(cpi,&x->e_mbd,&local_2bd8,BVar13,0);
    ext_part_controller = local_2bb0;
    local_2bf8[lVar8] = uVar7;
    lVar8 = lVar8 + 1;
    puVar15 = puVar15 + bVar1;
    iVar16 = iVar16 + iVar6;
  } while (lVar8 != 4);
  auVar19._0_4_ = (float)(pb_source_variance + 1);
  auVar19._4_4_ = auVar19._0_4_;
  auVar19._8_4_ = auVar19._0_4_;
  auVar19._12_4_ = auVar19._0_4_;
  auVar23._0_4_ =
       ((float)(local_2bf8[4] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[4] + 1 & 0xffff | 0x4b000000);
  auVar23._4_4_ =
       ((float)(local_2bf8[5] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[5] + 1 & 0xffff | 0x4b000000);
  auVar23._8_4_ =
       ((float)(local_2bf8[6] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[6] + 1 & 0xffff | 0x4b000000);
  auVar23._12_4_ =
       ((float)(local_2bf8[7] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[7] + 1 & 0xffff | 0x4b000000);
  auVar24 = divps(auVar23,auVar19);
  auVar24 = maxps(_DAT_005047e0,auVar24);
  local_2b78._540_16_ = minps(_DAT_005047f0,auVar24);
  auVar31._0_4_ =
       ((float)(local_2bf8[0] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[0] + 1 & 0xffff | 0x4b000000);
  auVar31._4_4_ =
       ((float)(local_2bf8[1] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[1] + 1 & 0xffff | 0x4b000000);
  auVar31._8_4_ =
       ((float)(local_2bf8[2] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[2] + 1 & 0xffff | 0x4b000000);
  auVar31._12_4_ =
       ((float)(local_2bf8[3] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[3] + 1 & 0xffff | 0x4b000000);
  auVar24 = divps(auVar31,auVar19);
  auVar24 = maxps(_DAT_005047e0,auVar24);
  local_294c = minps(_DAT_005047f0,auVar24);
  av1_ext_part_send_features(local_2bb0,(aom_partition_features_t *)local_2b78);
  _Var5 = av1_ext_part_get_partition_decision
                    (ext_part_controller,(aom_partition_decision_t *)local_2078);
  best_rd = local_2ba0;
  part_state = local_2ba8;
  if (_Var5) {
    part4_allowed[0] = local_3c;
    part4_allowed[1] = iStack_38;
  }
LAB_001f41b2:
  if (999999999 < best_rd || _Var5 != false) {
    return;
  }
  if (uVar12 == 0xc) {
    pNVar14 = &av1_4_partition_nnconfig_64;
LAB_001f41f1:
    bVar4 = false;
  }
  else {
    if (bsize == BLOCK_32X32) {
      pNVar14 = &av1_4_partition_nnconfig_32;
      goto LAB_001f41f1;
    }
    if (bsize == BLOCK_16X16) {
      pNVar14 = &av1_4_partition_nnconfig_16;
      goto LAB_001f41f1;
    }
    bVar4 = true;
    pNVar14 = (NN_CONFIG *)0x0;
  }
  if (bVar4) {
    return;
  }
  uVar7 = 0x1f;
  if (pb_source_variance != 0) {
    for (; pb_source_variance >> uVar7 == 0; uVar7 = uVar7 - 1) {
    }
  }
  iVar6 = (uVar7 ^ 0xffffffe0) + 0x21;
  if (pb_source_variance == 0) {
    iVar6 = 0;
  }
  local_2078._4_4_ = (float)iVar6;
  local_2078._0_4_ = (float)part_ctx;
  local_2b78._16_4_ = 0.0;
  local_2b78._20_4_ = 0.0;
  local_2b78._24_4_ = 0.0;
  local_2b78._28_4_ = 0.0;
  local_2b78._0_4_ = AOM_EXT_PART_FEATURE_BEFORE_NONE;
  local_2b78._4_4_ = 0.0;
  local_2b78._8_4_ = 0.0;
  local_2b78._12_4_ = 0.0;
  lVar8 = 0;
  do {
    lVar2 = part_state->rect_part_rd[0][lVar8];
    if (lVar2 - 1U < 999999999) {
      *(int *)(local_2b78 + lVar8 * 4) = (int)lVar2;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 == 1);
  lVar8 = 0;
  do {
    lVar2 = part_state->rect_part_rd[1][lVar8];
    if (lVar2 - 1U < 999999999) {
      *(int *)(local_2b78 + lVar8 * 4 + 8) = (int)lVar2;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 == 1);
  lVar8 = 0;
  do {
    if (part_state->split_rd[lVar8] - 1U < 999999999) {
      *(int *)(local_2b78 + lVar8 * 4 + 0x10) = (int)part_state->split_rd[lVar8];
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  iVar6 = (int)best_rd;
  auVar20._0_4_ = (float)iVar6;
  auVar20._4_4_ = auVar20._0_4_;
  auVar20._8_4_ = auVar20._0_4_;
  auVar20._12_4_ = auVar20._0_4_;
  lVar8 = 0;
  do {
    lVar2 = lVar8 * 4;
    uVar7 = *(uint *)(local_2b78 + lVar2);
    uVar22 = *(uint *)(local_2b78 + lVar2 + 4);
    uVar26 = *(uint *)(local_2b78 + lVar2 + 8);
    uVar27 = *(uint *)(local_2b78 + lVar2 + 0xc);
    uVar28 = -(uint)((int)uVar7 < iVar6 && 0 < (int)uVar7);
    uVar29 = -(uint)((int)uVar22 < iVar6 && 0 < (int)uVar22);
    uVar34 = -(uint)((int)uVar26 < iVar6 && 0 < (int)uVar26);
    uVar35 = -(uint)((int)uVar27 < iVar6 && 0 < (int)uVar27);
    auVar32._0_4_ =
         ((float)(uVar7 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar7 & 0xffff | 0x4b000000)
    ;
    auVar32._4_4_ =
         ((float)(uVar22 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar22 & 0xffff | 0x4b000000);
    auVar32._8_4_ =
         ((float)(uVar26 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar26 & 0xffff | 0x4b000000);
    auVar32._12_4_ =
         ((float)(uVar27 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar27 & 0xffff | 0x4b000000);
    auVar24 = divps(auVar32,auVar20);
    lVar2 = lVar8 * 4;
    *(uint *)(local_2078 + lVar2 + 8) = ~uVar28 & 0x3f800000 | auVar24._0_4_ & uVar28;
    *(uint *)(local_2078 + lVar2 + 0xc) = ~uVar29 & 0x3f800000 | auVar24._4_4_ & uVar29;
    *(uint *)(local_2078 + lVar2 + 0x10) = ~uVar34 & 0x3f800000 | auVar24._8_4_ & uVar34;
    *(uint *)(local_2078 + lVar2 + 0x14) = ~uVar35 & 0x3f800000 | auVar24._12_4_ & uVar35;
    lVar8 = lVar8 + 4;
  } while (lVar8 != 8);
  local_2bf8[4] = 0;
  local_2bf8[5] = 0;
  local_2bf8[6] = 0;
  local_2bf8[7] = 0;
  local_2bf8[0] = 0;
  local_2bf8[1] = 0;
  local_2bf8[2] = 0;
  local_2bf8[3] = 0;
  uVar11 = uVar12;
  switch(uVar12) {
  case 0:
    break;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
switchD_001f4369_caseD_1:
    uVar11 = 6;
    bVar4 = true;
    goto LAB_001f43a3;
  case 3:
    uVar11 = 1;
    break;
  case 6:
    uVar11 = 2;
    break;
  case 9:
    uVar11 = 3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      uVar11 = 4;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_001f4369_caseD_1;
      uVar11 = 5;
    }
  }
  bVar4 = false;
LAB_001f43a3:
  BVar18 = BLOCK_INVALID;
  if (!bVar4) {
    BVar18 = subsize_lookup[8][uVar11];
  }
  switch(uVar12) {
  case 0:
    bVar4 = false;
    uVar11 = uVar12;
    goto LAB_001f440b;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
switchD_001f43ca_caseD_1:
    bVar4 = true;
    uVar11 = 6;
    goto LAB_001f440b;
  case 3:
    uVar11 = 1;
    break;
  case 6:
    uVar11 = 2;
    break;
  case 9:
    uVar11 = 3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      uVar11 = 4;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_001f43ca_caseD_1;
      uVar11 = 5;
    }
  }
  bVar4 = false;
LAB_001f440b:
  BVar13 = BLOCK_INVALID;
  if (!bVar4) {
    BVar13 = subsize_lookup[9][uVar11];
  }
  av1_setup_src_planes
            (x,cpi->source,iVar10,iVar17,
             (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1,bsize);
  local_2bd8.stride = x->plane[0].src.stride;
  puVar3 = x->plane[0].src.buf;
  iVar10 = (uint)block_size_high[BVar18] * local_2bd8.stride;
  bVar1 = block_size_wide[BVar13];
  iVar17 = 0;
  lVar8 = 0;
  puVar15 = puVar3;
  local_2b80 = local_2bd8.stride;
  do {
    local_2b98 = (undefined1  [8])(puVar3 + iVar17);
    local_2bd8.buf = puVar15;
    uVar7 = av1_get_perpixel_variance_facade(cpi,&x->e_mbd,(buf_2d *)local_2b98,BVar18,0);
    local_2bf8[lVar8 + 4] = uVar7;
    uVar7 = av1_get_perpixel_variance_facade(cpi,&x->e_mbd,&local_2bd8,BVar13,0);
    local_2bf8[lVar8] = uVar7;
    lVar8 = lVar8 + 1;
    puVar15 = puVar15 + bVar1;
    iVar17 = iVar17 + iVar10;
  } while (lVar8 != 4);
  auVar21._0_4_ = (float)(pb_source_variance + 1);
  auVar21._4_4_ = auVar21._0_4_;
  auVar21._8_4_ = auVar21._0_4_;
  auVar21._12_4_ = auVar21._0_4_;
  auVar25._0_4_ =
       ((float)(local_2bf8[4] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[4] + 1 & 0xffff | 0x4b000000);
  auVar25._4_4_ =
       ((float)(local_2bf8[5] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[5] + 1 & 0xffff | 0x4b000000);
  auVar25._8_4_ =
       ((float)(local_2bf8[6] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[6] + 1 & 0xffff | 0x4b000000);
  auVar25._12_4_ =
       ((float)(local_2bf8[7] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[7] + 1 & 0xffff | 0x4b000000);
  auVar24 = divps(auVar25,auVar21);
  auVar24 = maxps(_DAT_005047e0,auVar24);
  local_2078._40_16_ = minps(_DAT_005047f0,auVar24);
  auVar33._0_4_ =
       ((float)(local_2bf8[0] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[0] + 1 & 0xffff | 0x4b000000);
  auVar33._4_4_ =
       ((float)(local_2bf8[1] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[1] + 1 & 0xffff | 0x4b000000);
  auVar33._8_4_ =
       ((float)(local_2bf8[2] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[2] + 1 & 0xffff | 0x4b000000);
  auVar33._12_4_ =
       ((float)(local_2bf8[3] + 1 >> 0x10 | 0x53000000) - 5.497642e+11) +
       (float)(local_2bf8[3] + 1 & 0xffff | 0x4b000000);
  auVar24 = divps(auVar33,auVar21);
  auVar24 = maxps(_DAT_005047e0,auVar24);
  local_2040 = minps(_DAT_005047f0,auVar24);
  if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
    write_features_to_file
              ((cpi->oxcf).partition_info_path,(cpi->ext_part_controller).test_mode != 0,
               (float *)local_2078,0x12,7,(BLOCK_SIZE)uVar12,in_stack_ffffffffffffd3b8,
               in_stack_ffffffffffffd3c0);
  }
  local_2b98 = (undefined1  [8])0x0;
  uStack_2b90 = (uint8_t *)0x0;
  (*av1_nn_predict)((float *)local_2078,pNVar14,1,(float *)local_2b98);
  uVar7 = (uint)((float)local_2b98._0_4_ * 100.0);
  uVar22 = (uint)((float)local_2b98._4_4_ * 100.0);
  local_2bd8.buf0._0_4_ = (uint)((float)uStack_2b90 * 100.0);
  local_2bd8.buf0._4_4_ = (uint)(uStack_2b90._4_4_ * 100.0);
  local_2bd8.buf = (uint8_t *)CONCAT44(uVar22,uVar7);
  uVar26 = ~-(uint)(-1000 < (int)uVar7) & 0xfffffc18 | uVar7 & -(uint)(-1000 < (int)uVar7);
  uVar27 = ~-(uint)(-1000 < (int)uVar22) & 0xfffffc18 | uVar22 & -(uint)(-1000 < (int)uVar22);
  uVar28 = ~-(uint)(-1000 < (int)(uint)local_2bd8.buf0) & 0xfffffc18 |
           (uint)local_2bd8.buf0 & -(uint)(-1000 < (int)(uint)local_2bd8.buf0);
  uVar29 = ~-(uint)(-1000 < (int)local_2bd8.buf0._4_4_) & 0xfffffc18 |
           local_2bd8.buf0._4_4_ & -(uint)(-1000 < (int)local_2bd8.buf0._4_4_);
  uVar7 = -(uint)((int)uVar28 < (int)uVar26);
  uVar22 = -(uint)((int)uVar29 < (int)uVar27);
  uVar7 = ~uVar7 & uVar28 | uVar26 & uVar7;
  uVar22 = ~uVar22 & uVar29 | uVar27 & uVar22;
  uVar26 = -(uint)((int)uVar22 < (int)uVar7);
  uVar7 = ~uVar26 & uVar22 | uVar7 & uVar26;
  if (bsize == BLOCK_64X64) {
    uVar7 = uVar7 - 200;
  }
  else if ((bsize == BLOCK_32X32) || (bsize == BLOCK_16X16)) {
    uVar7 = uVar7 - 500;
  }
  part4_allowed[0] = 0;
  part4_allowed[1] = 0;
  uVar12 = 0;
  do {
    if ((int)uVar7 <= *(int *)((long)&local_2bd8.buf + uVar12 * 4)) {
      if ((uVar12 & 1) != 0) {
        *part4_allowed = 1;
      }
      if (1 < uVar12) {
        part4_allowed[1] = 1;
      }
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 4);
  return;
}

Assistant:

void av1_ml_prune_4_partition(AV1_COMP *const cpi, MACROBLOCK *const x,
                              int part_ctx, int64_t best_rd,
                              PartitionSearchState *part_state,
                              int *part4_allowed,
                              unsigned int pb_source_variance) {
  const PartitionBlkParams blk_params = part_state->part_blk_params;
  const int mi_row = blk_params.mi_row;
  const int mi_col = blk_params.mi_col;
  const BLOCK_SIZE bsize = blk_params.bsize;

  int64_t(*rect_part_rd)[SUB_PARTITIONS_RECT] = part_state->rect_part_rd;
  int64_t *split_rd = part_state->split_rd;
  if (ext_ml_model_decision_after_part_ab(
          cpi, x, bsize, part_ctx, best_rd, rect_part_rd, split_rd,
          &part4_allowed[HORZ4], &part4_allowed[VERT4], pb_source_variance,
          mi_row, mi_col))
    return;

  if (best_rd >= 1000000000) return;
  int64_t *horz_rd = rect_part_rd[HORZ4];
  int64_t *vert_rd = rect_part_rd[VERT4];
  const NN_CONFIG *nn_config = NULL;
  // 4-way partitions are only allowed for these three square block sizes.
  switch (bsize) {
    case BLOCK_16X16: nn_config = &av1_4_partition_nnconfig_16; break;
    case BLOCK_32X32: nn_config = &av1_4_partition_nnconfig_32; break;
    case BLOCK_64X64: nn_config = &av1_4_partition_nnconfig_64; break;
    default: assert(0 && "Unexpected bsize.");
  }
  if (!nn_config) return;

  // Generate features.
  float features[FEATURES];
  int feature_index = 0;
  features[feature_index++] = (float)part_ctx;
  features[feature_index++] = (float)get_unsigned_bits(pb_source_variance);

  const int rdcost = (int)AOMMIN(INT_MAX, best_rd);
  int sub_block_rdcost[8] = { 0 };
  int rd_index = 0;
  for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
    if (horz_rd[i] > 0 && horz_rd[i] < 1000000000)
      sub_block_rdcost[rd_index] = (int)horz_rd[i];
    ++rd_index;
  }
  for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
    if (vert_rd[i] > 0 && vert_rd[i] < 1000000000)
      sub_block_rdcost[rd_index] = (int)vert_rd[i];
    ++rd_index;
  }
  for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
    if (split_rd[i] > 0 && split_rd[i] < 1000000000)
      sub_block_rdcost[rd_index] = (int)split_rd[i];
    ++rd_index;
  }
  for (int i = 0; i < 8; ++i) {
    // Ratio between the sub-block RD and the whole-block RD.
    float rd_ratio = 1.0f;
    if (sub_block_rdcost[i] > 0 && sub_block_rdcost[i] < rdcost)
      rd_ratio = (float)sub_block_rdcost[i] / (float)rdcost;
    features[feature_index++] = rd_ratio;
  }

  // Get variance of the 1:4 and 4:1 sub-blocks.
  unsigned int horz_4_source_var[SUB_PARTITIONS_PART4] = { 0 };
  unsigned int vert_4_source_var[SUB_PARTITIONS_PART4] = { 0 };
  {
    BLOCK_SIZE horz_4_bs = get_partition_subsize(bsize, PARTITION_HORZ_4);
    BLOCK_SIZE vert_4_bs = get_partition_subsize(bsize, PARTITION_VERT_4);

    assert(horz_4_bs != BLOCK_INVALID);
    assert(vert_4_bs != BLOCK_INVALID);

    av1_setup_src_planes(x, cpi->source, mi_row, mi_col,
                         av1_num_planes(&cpi->common), bsize);
    const int src_stride = x->plane[0].src.stride;
    uint8_t *src = x->plane[0].src.buf;
    const MACROBLOCKD *const xd = &x->e_mbd;

    struct buf_2d horz_4_src, vert_4_src;
    horz_4_src.stride = src_stride;
    vert_4_src.stride = src_stride;

    for (int i = 0; i < SUB_PARTITIONS_PART4; ++i) {
      horz_4_src.buf = src + i * block_size_high[horz_4_bs] * src_stride;
      vert_4_src.buf = src + i * block_size_wide[vert_4_bs];

      horz_4_source_var[i] = av1_get_perpixel_variance_facade(
          cpi, xd, &horz_4_src, horz_4_bs, AOM_PLANE_Y);
      vert_4_source_var[i] = av1_get_perpixel_variance_facade(
          cpi, xd, &vert_4_src, vert_4_bs, AOM_PLANE_Y);
    }
  }

  const float denom = (float)(pb_source_variance + 1);
  const float low_b = 0.1f;
  const float high_b = 10.0f;
  for (int i = 0; i < SUB_PARTITIONS_PART4; ++i) {
    // Ratio between the 4:1 sub-block variance and the whole-block variance.
    float var_ratio = (float)(horz_4_source_var[i] + 1) / denom;
    if (var_ratio < low_b) var_ratio = low_b;
    if (var_ratio > high_b) var_ratio = high_b;
    features[feature_index++] = var_ratio;
  }
  for (int i = 0; i < SUB_PARTITIONS_PART4; ++i) {
    // Ratio between the 1:4 sub-block RD and the whole-block RD.
    float var_ratio = (float)(vert_4_source_var[i] + 1) / denom;
    if (var_ratio < low_b) var_ratio = low_b;
    if (var_ratio > high_b) var_ratio = high_b;
    features[feature_index++] = var_ratio;
  }
  assert(feature_index == FEATURES);

  // Write features to file
  if (!frame_is_intra_only(&cpi->common)) {
    write_features_to_file(cpi->oxcf.partition_info_path,
                           cpi->ext_part_controller.test_mode, features,
                           FEATURES, 7, bsize, mi_row, mi_col);
  }

  // Calculate scores using the NN model.
  float score[LABELS] = { 0.0f };
  av1_nn_predict(features, nn_config, 1, score);
  int int_score[LABELS];
  int max_score = -1000;
  for (int i = 0; i < LABELS; ++i) {
    int_score[i] = (int)(100 * score[i]);
    max_score = AOMMAX(int_score[i], max_score);
  }

  // Make decisions based on the model scores.
  int thresh = max_score;
  switch (bsize) {
    case BLOCK_16X16: thresh -= 500; break;
    case BLOCK_32X32: thresh -= 500; break;
    case BLOCK_64X64: thresh -= 200; break;
    default: break;
  }
  av1_zero_array(part4_allowed, NUM_PART4_TYPES);
  for (int i = 0; i < LABELS; ++i) {
    if (int_score[i] >= thresh) {
      if ((i >> 0) & 1) part4_allowed[HORZ4] = 1;
      if ((i >> 1) & 1) part4_allowed[VERT4] = 1;
    }
  }
}